

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

P __thiscall ccs::ParserImpl::parseTerm(ParserImpl *this)

{
  Type TVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ParserImpl *in_RSI;
  P PVar6;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Alloc_hider local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  PVar6 = parseStep(this);
  _Var5 = PVar6.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((in_RSI->cur_).type == GT) {
    do {
      TVar1 = (in_RSI->lex_).next_.type;
      if ((STRING < TVar1) || ((0x140002U >> (TVar1 & (INT|OVERRIDE)) & 1) == 0)) break;
      advance(in_RSI);
      plVar2 = (long *)(this->fileName_)._M_dataplus._M_p;
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->fileName_)._M_string_length;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_60->_M_use_count = local_60->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_60->_M_use_count = local_60->_M_use_count + 1;
        }
      }
      local_68 = plVar2;
      parseStep((ParserImpl *)&stack0xffffffffffffffc0);
      (**(code **)(*plVar2 + 0x18))
                (&local_58,plVar2,&local_68,(ParserImpl *)&stack0xffffffffffffffc0);
      p_Var4 = p_Stack_50;
      _Var3._M_p = local_58._M_p;
      local_58._M_p = (pointer)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->fileName_)._M_string_length;
      (this->fileName_)._M_dataplus._M_p = _Var3._M_p;
      (this->fileName_)._M_string_length = (size_type)p_Var4;
      _Var5._M_pi = extraout_RDX;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var5._M_pi = extraout_RDX_00;
      }
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        _Var5._M_pi = extraout_RDX_01;
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        _Var5._M_pi = extraout_RDX_02;
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        _Var5._M_pi = extraout_RDX_03;
      }
    } while ((in_RSI->cur_).type == GT);
  }
  PVar6.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (P)PVar6.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ast::SelectorLeaf::P parseTerm() {
    auto left = parseStep();
    while (cur_.type == Token::GT) {
      // here we have to distinguish another step from a trailing '>'. again,
      // peeking for ident or '(' does the trick.
      if (!couldStartStep(lex_.peek())) return left;
      advance();
      left = left->descendant(left, parseStep());
    }
    return left;
  }